

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O2

sunrealtype N_VMinQuotientLocal_ManyVector(N_Vector num,N_Vector denom)

{
  long lVar1;
  sunindextype i;
  long lVar2;
  sunrealtype sVar3;
  double dVar4;
  
  sVar3 = 1.79769313486232e+308;
  for (lVar2 = 0; lVar2 < *num->content; lVar2 = lVar2 + 1) {
    lVar1 = *(long *)(*(long *)((long)num->content + 0x10) + lVar2 * 8);
    if (*(long *)(*(long *)(lVar1 + 8) + 0x170) == 0) {
      dVar4 = (double)N_VMinQuotient(lVar1,*(undefined8 *)
                                            (*(long *)((long)denom->content + 0x10) + lVar2 * 8));
    }
    else {
      dVar4 = (double)N_VMinQuotientLocal();
    }
    if (dVar4 <= sVar3) {
      sVar3 = dVar4;
    }
  }
  return sVar3;
}

Assistant:

sunrealtype MVAPPEND(N_VMinQuotientLocal)(N_Vector num, N_Vector denom)
{
  SUNFunctionBegin(num->sunctx);
  sunindextype i;
  sunrealtype min, lmin;

  /* initialize output*/
  min = SUN_BIG_REAL;

  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(num); i++)
  {
    /* check for nvminquotientlocal in subvector */
    if (MANYVECTOR_SUBVEC(num, i)->ops->nvminquotientlocal)
    {
      lmin = N_VMinQuotientLocal(MANYVECTOR_SUBVEC(num, i),
                                 MANYVECTOR_SUBVEC(denom, i));
      SUNCheckLastErrNoRet();
      min = (min < lmin) ? min : lmin;

      /* otherwise, call nvmin and accumulate to overall min */
    }
    else
    {
      lmin = N_VMinQuotient(MANYVECTOR_SUBVEC(num, i),
                            MANYVECTOR_SUBVEC(denom, i));
      SUNCheckLastErrNoRet();
      min = (min < lmin) ? min : lmin;
    }
  }

  return (min);
}